

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

CompressionFunction *
duckdb::BitpackingFun::GetFunction(CompressionFunction *__return_storage_ptr__,PhysicalType type)

{
  int iVar1;
  InternalException *this;
  undefined7 in_register_00000031;
  allocator local_39;
  string local_38;
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  switch(iVar1) {
  case 1:
  case 3:
    GetBitpackingFunction<signed_char,true>(type);
    break;
  case 2:
    GetBitpackingFunction<unsigned_char,true>(UINT8);
    break;
  case 4:
    GetBitpackingFunction<unsigned_short,true>(UINT16);
    break;
  case 5:
    GetBitpackingFunction<short,true>(INT16);
    break;
  case 6:
    GetBitpackingFunction<unsigned_int,true>(UINT32);
    break;
  case 7:
    GetBitpackingFunction<int,true>(INT32);
    break;
  case 8:
    GetBitpackingFunction<unsigned_long,true>(UINT64);
    break;
  case 9:
    GetBitpackingFunction<long,true>(INT64);
    break;
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
switchD_004a4a67_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_38,"Unsupported type for Bitpacking",&local_39);
    InternalException::InternalException(this,&local_38);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 0x17:
    GetBitpackingFunction<unsigned_long,false>(LIST);
    break;
  default:
    if (iVar1 == 0xcb) {
      GetBitpackingFunction<duckdb::uhugeint_t,true>(UINT128);
    }
    else {
      if (iVar1 != 0xcc) goto switchD_004a4a67_caseD_a;
      GetBitpackingFunction<duckdb::hugeint_t,true>(INT128);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CompressionFunction BitpackingFun::GetFunction(PhysicalType type) {
	switch (type) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return GetBitpackingFunction<int8_t>(type);
	case PhysicalType::INT16:
		return GetBitpackingFunction<int16_t>(type);
	case PhysicalType::INT32:
		return GetBitpackingFunction<int32_t>(type);
	case PhysicalType::INT64:
		return GetBitpackingFunction<int64_t>(type);
	case PhysicalType::UINT8:
		return GetBitpackingFunction<uint8_t>(type);
	case PhysicalType::UINT16:
		return GetBitpackingFunction<uint16_t>(type);
	case PhysicalType::UINT32:
		return GetBitpackingFunction<uint32_t>(type);
	case PhysicalType::UINT64:
		return GetBitpackingFunction<uint64_t>(type);
	case PhysicalType::INT128:
		return GetBitpackingFunction<hugeint_t>(type);
	case PhysicalType::UINT128:
		return GetBitpackingFunction<uhugeint_t>(type);
	case PhysicalType::LIST:
		return GetBitpackingFunction<uint64_t, false>(type);
	default:
		throw InternalException("Unsupported type for Bitpacking");
	}
}